

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_event_thread.c
# Opt level: O0

void ares_event_thread_process_fd
               (ares_event_thread_t *e,ares_socket_t fd,void *data,ares_event_flags_t flags)

{
  ares_fd_events_t local_2c;
  ares_fd_events_t event;
  ares_event_flags_t flags_local;
  void *data_local;
  ares_socket_t fd_local;
  ares_event_thread_t *e_local;
  
  local_2c.events = (uint)((flags & ARES_EVENT_FLAG_READ) != ARES_EVENT_FLAG_NONE);
  if ((flags & ARES_EVENT_FLAG_WRITE) != ARES_EVENT_FLAG_NONE) {
    local_2c.events = local_2c.events | 2;
  }
  local_2c.fd = fd;
  event.fd = flags;
  unique0x10000043 = data;
  ares_process_fds(e->channel,&local_2c,1,1);
  return;
}

Assistant:

static void ares_event_thread_process_fd(ares_event_thread_t *e,
                                         ares_socket_t fd, void *data,
                                         ares_event_flags_t flags)
{
  ares_fd_events_t event;
  (void)data;

  event.fd     = fd;
  event.events = 0;
  if (flags & ARES_EVENT_FLAG_READ) {
    event.events |= ARES_FD_EVENT_READ;
  }
  if (flags & ARES_EVENT_FLAG_WRITE) {
    event.events |= ARES_FD_EVENT_WRITE;
  }
  ares_process_fds(e->channel, &event, 1, ARES_PROCESS_FLAG_SKIP_NON_FD);
}